

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjComputeTruthTableStop(Gia_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  
  p->nTtVars = 0;
  p->nTtWords = 0;
  Vec_IntFreeP(&p->vTtNums);
  Vec_IntFreeP(&p->vTtNodes);
  __ptr = p->vTtInputs;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vTtInputs->pArray = (void **)0x0;
      __ptr = p->vTtInputs;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_00210084;
    }
    free(__ptr);
    p->vTtInputs = (Vec_Ptr_t *)0x0;
  }
LAB_00210084:
  __ptr_00 = p->vTtMemory;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vTtMemory->pArray = (word *)0x0;
      __ptr_00 = p->vTtMemory;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) {
        return;
      }
    }
    free(__ptr_00);
    p->vTtMemory = (Vec_Wrd_t *)0x0;
  }
  return;
}

Assistant:

void Gia_ObjComputeTruthTableStop( Gia_Man_t * p )
{
    p->nTtVars   = 0;
    p->nTtWords  = 0;
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_WrdFreeP( &p->vTtMemory );
}